

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

char * cmime_part_to_string(CMimePart_T *part,char *nl)

{
  char *s;
  bool bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  CMimeHeader_T *h;
  CMimeListElem_T *e;
  int with_headers;
  char *ptemp;
  char *content;
  char *out;
  char *nl_local;
  CMimePart_T *part_local;
  
  bVar1 = false;
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xb0,"char *cmime_part_to_string(CMimePart_T *, const char *)");
  }
  s = part->content;
  out = nl;
  if (nl == (char *)0x0) {
    if (s != (char *)0x0) {
      out = _cmime_internal_determine_linebreak(s);
    }
    if (out == (char *)0x0) {
      out = "\r\n";
    }
  }
  content = (char *)calloc(1,1);
  if (part->headers->size != 0) {
    for (h = (CMimeHeader_T *)part->headers->head; h != (CMimeHeader_T *)0x0;
        h = (CMimeHeader_T *)h->count) {
      __s = cmime_header_to_string((CMimeHeader_T *)h->name);
      sVar3 = strlen(__s);
      sVar4 = strlen(out);
      iVar2 = strcmp(__s + (sVar3 - sVar4),out);
      if (iVar2 == 0) {
        sVar3 = strlen(content);
        sVar4 = strlen(__s);
        content = (char *)realloc(content,sVar3 + sVar4 + 1);
        strcat(content,__s);
      }
      else {
        sVar3 = strlen(content);
        sVar4 = strlen(__s);
        sVar5 = strlen(out);
        content = (char *)realloc(content,sVar3 + sVar4 + sVar5 + 1);
        strcat(content,__s);
        strcat(content,out);
      }
      free(__s);
    }
    bVar1 = true;
  }
  if (bVar1) {
    sVar3 = strlen(content);
    sVar4 = strlen(out);
    content = (char *)realloc(content,sVar3 + sVar4 + 2);
    strcat(content,out);
  }
  if (s != (char *)0x0) {
    sVar3 = strlen(content);
    sVar4 = strlen(s);
    content = (char *)realloc(content,sVar3 + sVar4 + 2);
    strcat(content,s);
  }
  return content;
}

Assistant:

char *cmime_part_to_string(CMimePart_T *part, const char *nl) {
    char *out = NULL;
    char *content = NULL; 
    char *ptemp = NULL;
    int with_headers = 0;
    CMimeListElem_T *e;
    CMimeHeader_T *h;
    
    assert(part);

    content = cmime_part_get_content(part);
    
    if (nl == NULL) {
        if (content != NULL)
            nl = _cmime_internal_determine_linebreak(content);  
        
        if (nl == NULL)
            nl = CRLF;
    }

    out = (char *)calloc(1,sizeof(char));
    if (cmime_list_size(part->headers)!=0) {
        e = cmime_list_head(part->headers);
        while(e != NULL) {
            h = (CMimeHeader_T *)cmime_list_data(e);
            ptemp = cmime_header_to_string(h);
            /* check whether we have to add a newline, or not */
            if ( strcmp(ptemp + strlen(ptemp) - strlen(nl), nl) == 0) {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + 1);
                strcat(out,ptemp);
            } else {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + strlen(nl) + 1);
                strcat(out,ptemp);
                strcat(out,nl);
            }
            free(ptemp);
            e = e->next;
        } 
        with_headers = 1; 
    }
    
    if (with_headers==1) {
        out = (char *)realloc(out,strlen(out) + strlen(nl) + 2);
        strcat(out,nl);
    } 

    if (content != NULL) {
        out = (char *)realloc(out,strlen(out) + strlen(content) + 2);
        strcat(out,content);
    }
    return(out);
}